

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConvexDecomposition.cpp
# Opt level: O2

void __thiscall
chrono::collision::ChConvexDecompositionHACDv2::Reset(ChConvexDecompositionHACDv2 *this)

{
  undefined8 uVar1;
  pointer pCVar2;
  pointer pCVar3;
  
  (this->descriptor).mIndices = (HaU32 *)0x0;
  (this->descriptor).mTriangleCount = 0;
  (this->descriptor).mVertexCount = 0;
  (this->descriptor).mVertices = (HaF32 *)0x0;
  (this->descriptor).mMaxHullCount = 0x100;
  (this->descriptor).mMaxMergeHullCount = 0x100;
  (this->descriptor).mMaxHullVertices = 0x40;
  uVar1 = vmovlps_avx(SUB6416(ZEXT464(0x3e4ccccd),0));
  (this->descriptor).mConcavity = (HaF32)(int)uVar1;
  (this->descriptor).mSmallClusterThreshold = (HaF32)(int)((ulong)uVar1 >> 0x20);
  (this->descriptor).mCallback = (ICallback *)0x0;
  (*this->gHACD->_vptr_HACD_API[3])();
  pCVar2 = (this->points).
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->points).
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != pCVar2) {
    (this->points).
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_finish = pCVar2;
  }
  pCVar3 = (this->triangles).
           super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->triangles).
      super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pCVar3) {
    (this->triangles).
    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar3;
  }
  return;
}

Assistant:

void ChConvexDecompositionHACDv2::Reset(void) {
    this->descriptor.init();
    gHACD->releaseHACD();

    this->points.clear();
    this->triangles.clear();
}